

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O0

feed_db_status_t store_transfer_db(transfer_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char local_98 [8];
  char qr [108];
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  transfer_t *record_local;
  
  memcpy(local_98,
         "INSERT INTO transfers (from_stop_id, to_stop_id, transfer_type, min_transfer_time) values (?1, ?2, ?3, ?4);"
         ,0x6c);
  sqlite3_prepare_v2(db->conn,local_98,-1,(sqlite3_stmt **)(qr + 0x68),(char **)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,1,record->from_stop_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(stack0xffffffffffffffd8,2,record->to_stop_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(stack0xffffffffffffffd8,3,record->transfer_type);
  sqlite3_bind_int(stack0xffffffffffffffd8,4,record->min_transfer_time);
  iVar1 = sqlite3_step(stack0xffffffffffffffd8);
  db->rc = iVar1;
  bVar3 = db->rc == 0x65;
  if (bVar3) {
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  else {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
    sqlite3_finalize(stack0xffffffffffffffd8);
  }
  record_local._4_4_ = (feed_db_status_t)bVar3;
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_transfer_db(transfer_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO transfers ("
                    "from_stop_id, to_stop_id, transfer_type, min_transfer_time"
                ") values ("
                    "?1, ?2, ?3, ?4"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->from_stop_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->to_stop_id, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 3, (int)record->transfer_type);
    sqlite3_bind_int(stmt, 4, record->min_transfer_time);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}